

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::SetString
          (Reflection *this,Message *message,FieldDescriptor *field,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ReflectionSchema *this_00;
  byte bVar2;
  FieldType type;
  int number;
  CppStringType CVar3;
  uint32_t uVar4;
  InlinedStringField *pIVar5;
  string *this_01;
  OneofDescriptor *pOVar6;
  ArenaStringPtr *pAVar7;
  Cord *pCVar8;
  Cord **ppCVar9;
  Nonnull<const_char_*> pcVar10;
  bool bVar11;
  char *description;
  Arena *pAVar12;
  Descriptor *pDVar13;
  pointer pcVar14;
  size_type sVar15;
  Metadata MVar16;
  string_view src;
  size_type *local_60;
  size_type local_58;
  size_type local_50;
  undefined8 uStack_48;
  
  MVar16 = Message::GetMetadata(message);
  if (MVar16.reflection != this) {
    pDVar13 = this->descriptor_;
    MVar16 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar13,MVar16.descriptor,field,"SetString");
  }
  pDVar13 = this->descriptor_;
  if (field->containing_type_ != pDVar13) {
    description = "Field does not match message type.";
    goto LAB_002a3e18;
  }
  bVar2 = field->field_0x1;
  bVar11 = (bool)((bVar2 & 0x20) >> 5);
  if (0xbf < bVar2 == bVar11) {
    pcVar10 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                        (bVar11,0xbf < bVar2,
                         "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar10 == (Nonnull<const_char_*>)0x0) {
    if ((field->field_0x1 & 0x20) == 0) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"SetString",CPPTYPE_STRING);
      }
      if ((field->field_0x1 & 8) != 0) {
        uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        number = field->number_;
        type = field->type_;
        local_60 = (size_type *)(value->_M_dataplus)._M_p;
        paVar1 = &value->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60 == paVar1) {
          local_50 = paVar1->_M_allocated_capacity;
          uStack_48 = *(undefined8 *)((long)&value->field_2 + 8);
          local_60 = &local_50;
        }
        else {
          local_50 = paVar1->_M_allocated_capacity;
        }
        local_58 = value->_M_string_length;
        (value->_M_dataplus)._M_p = (pointer)paVar1;
        value->_M_string_length = 0;
        (value->field_2)._M_local_buf[0] = '\0';
        this_01 = internal::ExtensionSet::MutableString_abi_cxx11_
                            ((ExtensionSet *)
                             ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
                             number,type,field);
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_60);
        if (local_60 != &local_50) {
          operator_delete(local_60,local_50 + 1);
        }
        return;
      }
      CVar3 = FieldDescriptor::cpp_string_type(field);
      if ((CVar3 == kView) || (CVar3 == kString)) {
        this_00 = &this->schema_;
        bVar11 = internal::ReflectionSchema::IsFieldInlined(this_00,field);
        if (!bVar11) {
          bVar11 = internal::ReflectionSchema::InRealOneof(this_00,field);
          if (bVar11) {
            if ((field->field_0x1 & 0x10) == 0) {
              pOVar6 = (OneofDescriptor *)0x0;
            }
            else {
              pOVar6 = (field->scope_).containing_oneof;
              if (pOVar6 == (OneofDescriptor *)0x0) goto LAB_002a3e45;
            }
            uVar4 = GetOneofCase(this,message,pOVar6);
            if (uVar4 != field->number_) {
              pOVar6 = FieldDescriptor::containing_oneof(field);
              ClearOneof(this,message,pOVar6);
              pAVar7 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
              (pAVar7->tagged_ptr_).ptr_ = &internal::fixed_address_empty_string;
            }
          }
          pAVar7 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
          pAVar12 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
          if (((ulong)pAVar12 & 1) != 0) {
            pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
          }
          internal::ArenaStringPtr::Set(pAVar7,value,pAVar12);
          return;
        }
        uVar4 = internal::ReflectionSchema::InlinedStringIndex(this_00,field);
        if (uVar4 == 0) {
          pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>(0,0,"index > 0u")
          ;
        }
        else {
          pcVar10 = (Nonnull<const_char_*>)0x0;
        }
        if (pcVar10 != (Nonnull<const_char_*>)0x0) {
          SetString();
LAB_002a3e45:
          internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb31);
        }
        if ((this->schema_).inlined_string_donated_offset_ != -1) {
          internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
          pIVar5 = MutableField<google::protobuf::internal::InlinedStringField>(this,message,field);
          pcVar14 = (value->_M_dataplus)._M_p;
          IsInlinedStringDonated(this,message,field);
          std::__cxx11::string::_M_replace
                    ((ulong)pIVar5,0,(char *)(pIVar5->field_0).str_._M_string_length,(ulong)pcVar14)
          ;
          return;
        }
        pAVar12 = (Arena *)&stack0xffffffffffffffc0;
        SetString();
LAB_002a3dad:
        pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
LAB_002a3cfc:
        if (pAVar12 == (Arena *)0x0) {
          pCVar8 = (Cord *)operator_new(0x10);
        }
        else {
          pCVar8 = (Cord *)Arena::AllocateAlignedWithCleanup
                                     (pAVar12,0x10,8,
                                      internal::cleanup::
                                      arena_destruct_object<absl::lts_20250127::Cord>);
        }
        (pCVar8->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
        (pCVar8->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
        ppCVar9 = MutableField<absl::lts_20250127::Cord*>(this,message,field);
        *ppCVar9 = pCVar8;
      }
      else {
        if (CVar3 != kCord) {
          return;
        }
        bVar11 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
        if (!bVar11) {
          pcVar14 = (value->_M_dataplus)._M_p;
          sVar15 = value->_M_string_length;
          pCVar8 = MutableField<absl::lts_20250127::Cord>(this,message,field);
          goto LAB_002a3d4d;
        }
        if ((field->field_0x1 & 0x10) == 0) {
          pOVar6 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar6 = (field->scope_).containing_oneof;
          if (pOVar6 == (OneofDescriptor *)0x0) goto LAB_002a3e45;
        }
        uVar4 = GetOneofCase(this,message,pOVar6);
        if (uVar4 != field->number_) {
          if ((field->field_0x1 & 0x10) == 0) {
            pOVar6 = (OneofDescriptor *)0x0;
          }
          else {
            pOVar6 = (field->scope_).containing_oneof;
            if (pOVar6 == (OneofDescriptor *)0x0) goto LAB_002a3e45;
          }
          ClearOneof(this,message,pOVar6);
          pAVar12 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
          if (((ulong)pAVar12 & 1) != 0) goto LAB_002a3dad;
          goto LAB_002a3cfc;
        }
      }
      pcVar14 = (value->_M_dataplus)._M_p;
      sVar15 = value->_M_string_length;
      ppCVar9 = MutableField<absl::lts_20250127::Cord*>(this,message,field);
      pCVar8 = *ppCVar9;
LAB_002a3d4d:
      src._M_str = pcVar14;
      src._M_len = sVar15;
      absl::lts_20250127::Cord::operator=(pCVar8,src);
      return;
    }
  }
  else {
    SetString();
  }
  pDVar13 = this->descriptor_;
  description = "Field is repeated; the method requires a singular field.";
LAB_002a3e18:
  anon_unknown_6::ReportReflectionUsageError(pDVar13,field,"SetString",description);
}

Assistant:

void Reflection::SetString(Message* message, const FieldDescriptor* field,
                           std::string value) const {
  USAGE_MUTABLE_CHECK_ALL(SetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return MutableExtensionSet(message)->SetString(
        field->number(), field->type(), std::move(value), field);
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          if (!HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            *MutableField<absl::Cord*>(message, field) =
                Arena::Create<absl::Cord>(message->GetArena());
          }
          *(*MutableField<absl::Cord*>(message, field)) = value;
          break;
        }
        *MutableField<absl::Cord>(message, field) = value;
        break;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString: {
        if (IsInlined(field)) {
          const uint32_t index = schema_.InlinedStringIndex(field);
          ABSL_DCHECK_GT(index, 0u);
          uint32_t* states =
              &MutableInlinedStringDonatedArray(message)[index / 32];
          uint32_t mask = ~(static_cast<uint32_t>(1) << (index % 32));
          MutableField<InlinedStringField>(message, field)
              ->Set(value, message->GetArena(),
                    IsInlinedStringDonated(*message, field), states, mask,
                    message);
          break;
        } else if (IsMicroString(field)) {
          if (schema_.InRealOneof(field) && !HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            MutableField<MicroString>(message, field)->InitDefault();
          }
          MutableField<MicroString>(message, field)
              ->Set(std::move(value), message->GetArena());
          break;
        }

        // Oneof string fields are never set as a default instance.
        // We just need to pass some arbitrary default string to make it work.
        // This allows us to not have the real default accessible from
        // reflection.
        if (schema_.InRealOneof(field) && !HasOneofField(*message, field)) {
          ClearOneof(message, field->containing_oneof());
          MutableField<ArenaStringPtr>(message, field)->InitDefault();
        }
        MutableField<ArenaStringPtr>(message, field)
            ->Set(std::move(value), message->GetArena());
        break;
      }
    }
  }
}